

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlParseReference(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlEntityType xVar2;
  charactersSAXFunc UNRECOVERED_JUMPTABLE;
  _xmlNode *p_Var3;
  _xmlDoc *p_Var4;
  uint val;
  int iVar5;
  xmlParserErrors xVar6;
  xmlEntityPtr ent;
  ulong uVar7;
  xmlChar *pxVar8;
  xmlNodePtr pxVar9;
  xmlNodePtr pxVar10;
  referenceSAXFunc p_Var11;
  xmlParserCtxtPtr pxVar12;
  size_t sVar13;
  char *__format;
  _xmlNode *p_Var14;
  void *pvVar15;
  _xmlNode **pp_Var16;
  unsigned_long uVar17;
  _xmlNode *p_Var18;
  bool bVar19;
  xmlNodePtr list;
  xmlChar out [16];
  
  list = (xmlNodePtr)0x0;
  pxVar8 = ctxt->input->cur;
  if (*pxVar8 != '&') {
    return;
  }
  if (pxVar8[1] == '#') {
    bVar1 = pxVar8[2];
    val = xmlParseCharRef(ctxt);
    if (val == 0) {
      return;
    }
    if (ctxt->charset == 1) {
      iVar5 = xmlCopyCharMultiByte(out,val);
      out[iVar5] = '\0';
      if (ctxt->sax == (_xmlSAXHandler *)0x0) {
        return;
      }
      UNRECOVERED_JUMPTABLE = ctxt->sax->characters;
      if (UNRECOVERED_JUMPTABLE == (charactersSAXFunc)0x0) {
        return;
      }
      if (ctxt->disableSAX != 0) {
        return;
      }
      (*UNRECOVERED_JUMPTABLE)(ctxt->userData,out,iVar5);
      return;
    }
    if ((int)val < 0x100) {
      out[0] = (xmlChar)val;
      out[1] = '\0';
      if (ctxt->sax == (_xmlSAXHandler *)0x0) {
        return;
      }
      UNRECOVERED_JUMPTABLE = ctxt->sax->characters;
      if (UNRECOVERED_JUMPTABLE == (charactersSAXFunc)0x0) {
        return;
      }
      if (ctxt->disableSAX != 0) {
        return;
      }
      (*UNRECOVERED_JUMPTABLE)(ctxt->userData,out,1);
      return;
    }
    __format = "#%d";
    if ((bVar1 & 0xdf) == 0x58) {
      __format = "#x%X";
    }
    snprintf((char *)out,0x10,__format,(ulong)val);
    if (ctxt->sax == (_xmlSAXHandler *)0x0) {
      return;
    }
    p_Var11 = ctxt->sax->reference;
    if (p_Var11 == (referenceSAXFunc)0x0) {
      return;
    }
    if (ctxt->disableSAX != 0) {
      return;
    }
    pvVar15 = ctxt->userData;
    pxVar8 = out;
    goto LAB_0015d284;
  }
  ent = xmlParseEntityRef(ctxt);
  if (ent == (xmlEntityPtr)0x0) {
    return;
  }
  if (ctxt->wellFormed == 0) {
    return;
  }
  if ((ent->name == (xmlChar *)0x0) || (xVar2 = ent->etype, xVar2 == XML_INTERNAL_PREDEFINED_ENTITY)
     ) {
    pxVar8 = ent->content;
    if (pxVar8 == (xmlChar *)0x0) {
      return;
    }
    if (ctxt->sax == (_xmlSAXHandler *)0x0) {
      return;
    }
    UNRECOVERED_JUMPTABLE = ctxt->sax->characters;
    if (UNRECOVERED_JUMPTABLE == (charactersSAXFunc)0x0) {
      return;
    }
    if (ctxt->disableSAX != 0) {
      return;
    }
    pvVar15 = ctxt->userData;
    iVar5 = xmlStrlen(pxVar8);
    (*UNRECOVERED_JUMPTABLE)(pvVar15,pxVar8,iVar5);
    return;
  }
  iVar5 = ent->checked;
  if ((iVar5 == 0) || ((ent->children == (_xmlNode *)0x0 && ((ctxt->options & 2) != 0)))) {
    if (xVar2 == XML_EXTERNAL_GENERAL_PARSED_ENTITY) {
      if ((ctxt->options & 0x12) == 0) goto LAB_0015d308;
      uVar17 = ctxt->nbentities;
      pxVar12 = (xmlParserCtxtPtr)0x0;
      if ((xmlParserCtxtPtr)ctxt->userData != ctxt) {
        pxVar12 = (xmlParserCtxtPtr)ctxt->userData;
      }
      iVar5 = ctxt->depth + 1;
      ctxt->depth = iVar5;
      xVar6 = xmlParseExternalEntityPrivate
                        (ctxt->myDoc,ctxt,ctxt->sax,pxVar12,iVar5,ent->URI,ent->ExternalID,&list);
LAB_0015d40b:
      ctxt->depth = ctxt->depth + -1;
    }
    else {
      uVar17 = ctxt->nbentities;
      if (xVar2 == XML_INTERNAL_GENERAL_ENTITY) {
        pxVar12 = (xmlParserCtxtPtr)0x0;
        if ((xmlParserCtxtPtr)ctxt->userData != ctxt) {
          pxVar12 = (xmlParserCtxtPtr)ctxt->userData;
        }
        ctxt->depth = ctxt->depth + 1;
        xVar6 = xmlParseBalancedChunkMemoryInternal(ctxt,ent->content,pxVar12,&list);
        goto LAB_0015d40b;
      }
      xmlErrMsgStr(ctxt,XML_ERR_INTERNAL_ERROR,"invalid entity type found\n",(xmlChar *)0x0);
      xVar6 = XML_ERR_ENTITY_PE_INTERNAL;
    }
    uVar7 = (ctxt->nbentities - uVar17) + 1;
    if (0x3ffffffe < uVar7) {
      uVar7 = 0x3fffffff;
    }
    ent->checked = (int)uVar7 * 2;
    if ((ent->content != (xmlChar *)0x0) &&
       (pxVar8 = xmlStrchr(ent->content,'<'), pxVar8 != (xmlChar *)0x0)) {
      *(byte *)&ent->checked = (byte)ent->checked | 1;
    }
    if (xVar6 == XML_ERR_ENTITY_LOOP) {
      xmlFatalErr(ctxt,XML_ERR_ENTITY_LOOP,(char *)0x0);
      xmlHaltParser(ctxt);
LAB_0015d4e2:
      xmlFreeNodeList(list);
      return;
    }
    iVar5 = xmlParserEntityCheck(ctxt,0,ent,0);
    if (iVar5 != 0) goto LAB_0015d4e2;
    if (list == (xmlNodePtr)0x0 || xVar6 != XML_ERR_OK) {
      if ((xVar6 == XML_ERR_OK) || (xVar6 == XML_WAR_UNDECLARED_ENTITY)) {
        if (list != (xmlNodePtr)0x0) goto LAB_0015d77e;
      }
      else {
        xmlFatalErrMsgStr(ctxt,XML_ERR_UNDECLARED_ENTITY,"Entity \'%s\' failed to parse\n",ent->name
                         );
        if (ent->content != (xmlChar *)0x0) {
          *ent->content = '\0';
        }
        xmlParserEntityCheck(ctxt,0,ent,0);
      }
    }
    else {
      if ((ent->etype - XML_INTERNAL_GENERAL_ENTITY < 2) && (ent->children == (_xmlNode *)0x0)) {
        ent->children = list;
        if (((ctxt->replaceEntities != 0) && (ctxt->parseMode != XML_PARSE_READER)) &&
           ((list->type != XML_TEXT_NODE || (list->next != (_xmlNode *)0x0)))) {
          ent->owner = 0;
          p_Var4 = ctxt->myDoc;
          p_Var18 = ctxt->node;
          p_Var3 = list;
          while (p_Var14 = p_Var3, p_Var14 != (_xmlNode *)0x0) {
            p_Var14->parent = p_Var18;
            p_Var14->doc = p_Var4;
            p_Var3 = p_Var14->next;
            if (p_Var3 == (_xmlNode *)0x0) {
              ent->last = p_Var14;
            }
          }
          goto LAB_0015d789;
        }
        ent->owner = 1;
        p_Var18 = list;
        while (list = p_Var18, list != (xmlNodePtr)0x0) {
          list->parent = (_xmlNode *)ent;
          if (list->doc != ent->doc) {
            xmlSetTreeDoc(list,ent->doc);
          }
          p_Var18 = list->next;
          if (p_Var18 == (_xmlNode *)0x0) {
            ent->last = list;
          }
        }
      }
      else {
LAB_0015d77e:
        xmlFreeNodeList(list);
      }
      list = (xmlNodePtr)0x0;
    }
LAB_0015d789:
    if (ent->checked == 0) {
      ent->checked = 2;
    }
    if (ent->children == (_xmlNode *)0x0) goto LAB_0015d7a9;
LAB_0015d329:
    pp_Var16 = &ent->children;
    if ((((ctxt->sax == (_xmlSAXHandler *)0x0) ||
         (p_Var11 = ctxt->sax->reference, p_Var11 == (referenceSAXFunc)0x0)) ||
        (ctxt->replaceEntities != 0)) || (ctxt->disableSAX != 0)) {
      if (ctxt->replaceEntities == 0) {
        return;
      }
      if (ctxt->node == (xmlNodePtr)0x0) {
        return;
      }
      if (list == (xmlNodePtr)0x0) {
        if ((ent->owner == 0) || (ctxt->parseMode == XML_PARSE_READER)) goto LAB_0015d5a3;
      }
      else {
        if (ctxt->parseMode == XML_PARSE_READER) {
LAB_0015d5a3:
          sVar13 = ctxt->sizeentcopy + (long)ent->length + 5;
          ctxt->sizeentcopy = sVar13;
          iVar5 = xmlParserEntityCheck(ctxt,0,ent,sVar13);
          if (iVar5 != 0) {
            return;
          }
          do {
            pxVar10 = *pp_Var16;
            if (pxVar10 == (xmlNodePtr)0x0) goto LAB_0015d6f5;
            pxVar9 = xmlDocCopyNode(pxVar10,ctxt->myDoc,1);
            if (pxVar9 == (xmlNodePtr)0x0) {
              pxVar9 = (xmlNodePtr)0x0;
            }
            else {
              if (pxVar9->_private == (void *)0x0) {
                pxVar9->_private = pxVar10->_private;
              }
              pxVar9 = xmlAddChild(ctxt->node,pxVar9);
            }
            pp_Var16 = &pxVar10->next;
          } while (pxVar10 != ent->last);
          if (((ctxt->parseMode == XML_PARSE_READER) && (pxVar9 != (xmlNodePtr)0x0)) &&
             ((pxVar9->type == XML_ELEMENT_NODE && (pxVar9->children == (_xmlNode *)0x0)))) {
            pxVar9->extra = 1;
          }
          goto LAB_0015d6f5;
        }
        if (ctxt->inputNr < 1) {
          pxVar8 = xmlDictLookup(ctxt->dict,(xmlChar *)"nbktext",-1);
          pxVar10 = *pp_Var16;
          if (pxVar10->type == XML_TEXT_NODE) {
            pxVar10->name = pxVar8;
          }
          pxVar9 = ent->last;
          if ((pxVar9 != pxVar10) && (pxVar9->type == XML_TEXT_NODE)) {
            pxVar9->name = pxVar8;
          }
          xmlAddChildList(ctxt->node,pxVar10);
          goto LAB_0015d6f5;
        }
      }
      sVar13 = ctxt->sizeentcopy + (long)ent->length + 5;
      ctxt->sizeentcopy = sVar13;
      iVar5 = xmlParserEntityCheck(ctxt,0,ent,sVar13);
      if (iVar5 != 0) {
        return;
      }
      p_Var18 = ent->children;
      p_Var3 = ent->last;
      ent->children = (_xmlNode *)0x0;
      ent->last = (_xmlNode *)0x0;
      do {
        if (p_Var18 == (xmlNodePtr)0x0) break;
        p_Var14 = p_Var18->next;
        p_Var18->parent = (_xmlNode *)0x0;
        p_Var18->next = (_xmlNode *)0x0;
        pxVar10 = xmlDocCopyNode(p_Var18,ctxt->myDoc,1);
        if (pxVar10 != (xmlNodePtr)0x0) {
          if (pxVar10->_private == (void *)0x0) {
            pxVar10->_private = p_Var18->_private;
          }
          xmlAddChild((xmlNodePtr)ent,pxVar10);
        }
        xmlAddChild(ctxt->node,p_Var18);
        bVar19 = p_Var18 != p_Var3;
        p_Var18 = p_Var14;
      } while (bVar19);
      if (ent->owner == 0) {
        ent->owner = 1;
      }
LAB_0015d6f5:
      ctxt->nodelen = 0;
      ctxt->nodemem = 0;
      return;
    }
  }
  else {
LAB_0015d308:
    if (iVar5 != 1) {
      ctxt->nbentities = ctxt->nbentities + (long)(iVar5 / 2);
    }
    if (ent->children != (_xmlNode *)0x0) goto LAB_0015d329;
    if (iVar5 != 0) {
      pxVar12 = (xmlParserCtxtPtr)0x0;
      if ((xmlParserCtxtPtr)ctxt->userData != ctxt) {
        pxVar12 = (xmlParserCtxtPtr)ctxt->userData;
      }
      if (xVar2 == XML_EXTERNAL_GENERAL_PARSED_ENTITY) {
        iVar5 = ctxt->depth + 1;
        ctxt->depth = iVar5;
        xVar6 = xmlParseExternalEntityPrivate
                          (ctxt->myDoc,ctxt,ctxt->sax,pxVar12,iVar5,ent->URI,ent->ExternalID,
                           (xmlNodePtr *)0x0);
      }
      else {
        if (xVar2 != XML_INTERNAL_GENERAL_ENTITY) {
          xmlErrMsgStr(ctxt,XML_ERR_INTERNAL_ERROR,"invalid entity type found\n",(xmlChar *)0x0);
          goto LAB_0015d7a9;
        }
        ctxt->depth = ctxt->depth + 1;
        xVar6 = xmlParseBalancedChunkMemoryInternal(ctxt,ent->content,pxVar12,(xmlNodePtr *)0x0);
      }
      ctxt->depth = ctxt->depth + -1;
      if (xVar6 == XML_ERR_ENTITY_LOOP) {
        xmlFatalErr(ctxt,XML_ERR_ENTITY_LOOP,(char *)0x0);
        return;
      }
    }
LAB_0015d7a9:
    if (ctxt->sax == (_xmlSAXHandler *)0x0) {
      return;
    }
    p_Var11 = ctxt->sax->reference;
    if (p_Var11 == (referenceSAXFunc)0x0) {
      return;
    }
    if (ctxt->replaceEntities != 0) {
      return;
    }
    if (ctxt->disableSAX != 0) {
      return;
    }
  }
  pvVar15 = ctxt->userData;
  pxVar8 = ent->name;
LAB_0015d284:
  (*p_Var11)(pvVar15,pxVar8);
  return;
}

Assistant:

void
xmlParseReference(xmlParserCtxtPtr ctxt) {
    xmlEntityPtr ent;
    xmlChar *val;
    int was_checked;
    xmlNodePtr list = NULL;
    xmlParserErrors ret = XML_ERR_OK;


    if (RAW != '&')
        return;

    /*
     * Simple case of a CharRef
     */
    if (NXT(1) == '#') {
	int i = 0;
	xmlChar out[16];
	int hex = NXT(2);
	int value = xmlParseCharRef(ctxt);

	if (value == 0)
	    return;
	if (ctxt->charset != XML_CHAR_ENCODING_UTF8) {
	    /*
	     * So we are using non-UTF-8 buffers
	     * Check that the char fit on 8bits, if not
	     * generate a CharRef.
	     */
	    if (value <= 0xFF) {
		out[0] = value;
		out[1] = 0;
		if ((ctxt->sax != NULL) && (ctxt->sax->characters != NULL) &&
		    (!ctxt->disableSAX))
		    ctxt->sax->characters(ctxt->userData, out, 1);
	    } else {
		if ((hex == 'x') || (hex == 'X'))
		    snprintf((char *)out, sizeof(out), "#x%X", value);
		else
		    snprintf((char *)out, sizeof(out), "#%d", value);
		if ((ctxt->sax != NULL) && (ctxt->sax->reference != NULL) &&
		    (!ctxt->disableSAX))
		    ctxt->sax->reference(ctxt->userData, out);
	    }
	} else {
	    /*
	     * Just encode the value in UTF-8
	     */
	    COPY_BUF(0 ,out, i, value);
	    out[i] = 0;
	    if ((ctxt->sax != NULL) && (ctxt->sax->characters != NULL) &&
		(!ctxt->disableSAX))
		ctxt->sax->characters(ctxt->userData, out, i);
	}
	return;
    }

    /*
     * We are seeing an entity reference
     */
    ent = xmlParseEntityRef(ctxt);
    if (ent == NULL) return;
    if (!ctxt->wellFormed)
	return;
    was_checked = ent->checked;

    /* special case of predefined entities */
    if ((ent->name == NULL) ||
        (ent->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {
	val = ent->content;
	if (val == NULL) return;
	/*
	 * inline the entity.
	 */
	if ((ctxt->sax != NULL) && (ctxt->sax->characters != NULL) &&
	    (!ctxt->disableSAX))
	    ctxt->sax->characters(ctxt->userData, val, xmlStrlen(val));
	return;
    }

    /*
     * The first reference to the entity trigger a parsing phase
     * where the ent->children is filled with the result from
     * the parsing.
     * Note: external parsed entities will not be loaded, it is not
     * required for a non-validating parser, unless the parsing option
     * of validating, or substituting entities were given. Doing so is
     * far more secure as the parser will only process data coming from
     * the document entity by default.
     */
    if (((ent->checked == 0) ||
         ((ent->children == NULL) && (ctxt->options & XML_PARSE_NOENT))) &&
        ((ent->etype != XML_EXTERNAL_GENERAL_PARSED_ENTITY) ||
         (ctxt->options & (XML_PARSE_NOENT | XML_PARSE_DTDVALID)))) {
	unsigned long oldnbent = ctxt->nbentities, diff;

	/*
	 * This is a bit hackish but this seems the best
	 * way to make sure both SAX and DOM entity support
	 * behaves okay.
	 */
	void *user_data;
	if (ctxt->userData == ctxt)
	    user_data = NULL;
	else
	    user_data = ctxt->userData;

	/*
	 * Check that this entity is well formed
	 * 4.3.2: An internal general parsed entity is well-formed
	 * if its replacement text matches the production labeled
	 * content.
	 */
	if (ent->etype == XML_INTERNAL_GENERAL_ENTITY) {
	    ctxt->depth++;
	    ret = xmlParseBalancedChunkMemoryInternal(ctxt, ent->content,
	                                              user_data, &list);
	    ctxt->depth--;

	} else if (ent->etype == XML_EXTERNAL_GENERAL_PARSED_ENTITY) {
	    ctxt->depth++;
	    ret = xmlParseExternalEntityPrivate(ctxt->myDoc, ctxt, ctxt->sax,
	                                   user_data, ctxt->depth, ent->URI,
					   ent->ExternalID, &list);
	    ctxt->depth--;
	} else {
	    ret = XML_ERR_ENTITY_PE_INTERNAL;
	    xmlErrMsgStr(ctxt, XML_ERR_INTERNAL_ERROR,
			 "invalid entity type found\n", NULL);
	}

	/*
	 * Store the number of entities needing parsing for this entity
	 * content and do checkings
	 */
        diff = ctxt->nbentities - oldnbent + 1;
        if (diff > INT_MAX / 2)
            diff = INT_MAX / 2;
        ent->checked = diff * 2;
	if ((ent->content != NULL) && (xmlStrchr(ent->content, '<')))
	    ent->checked |= 1;
	if (ret == XML_ERR_ENTITY_LOOP) {
	    xmlFatalErr(ctxt, XML_ERR_ENTITY_LOOP, NULL);
            xmlHaltParser(ctxt);
	    xmlFreeNodeList(list);
	    return;
	}
	if (xmlParserEntityCheck(ctxt, 0, ent, 0)) {
	    xmlFreeNodeList(list);
	    return;
	}

	if ((ret == XML_ERR_OK) && (list != NULL)) {
	    if (((ent->etype == XML_INTERNAL_GENERAL_ENTITY) ||
	     (ent->etype == XML_EXTERNAL_GENERAL_PARSED_ENTITY))&&
		(ent->children == NULL)) {
		ent->children = list;
                /*
                 * Prune it directly in the generated document
                 * except for single text nodes.
                 */
                if ((ctxt->replaceEntities == 0) ||
                    (ctxt->parseMode == XML_PARSE_READER) ||
                    ((list->type == XML_TEXT_NODE) &&
                     (list->next == NULL))) {
                    ent->owner = 1;
                    while (list != NULL) {
                        list->parent = (xmlNodePtr) ent;
                        if (list->doc != ent->doc)
                            xmlSetTreeDoc(list, ent->doc);
                        if (list->next == NULL)
                            ent->last = list;
                        list = list->next;
                    }
                    list = NULL;
                } else {
                    ent->owner = 0;
                    while (list != NULL) {
                        list->parent = (xmlNodePtr) ctxt->node;
                        list->doc = ctxt->myDoc;
                        if (list->next == NULL)
                            ent->last = list;
                        list = list->next;
                    }
                    list = ent->children;
#ifdef LIBXML_LEGACY_ENABLED
                    if (ent->etype == XML_EXTERNAL_GENERAL_PARSED_ENTITY)
                        xmlAddEntityReference(ent, list, NULL);
#endif /* LIBXML_LEGACY_ENABLED */
                }
	    } else {
		xmlFreeNodeList(list);
		list = NULL;
	    }
	} else if ((ret != XML_ERR_OK) &&
		   (ret != XML_WAR_UNDECLARED_ENTITY)) {
	    xmlFatalErrMsgStr(ctxt, XML_ERR_UNDECLARED_ENTITY,
		     "Entity '%s' failed to parse\n", ent->name);
            if (ent->content != NULL)
                ent->content[0] = 0;
	    xmlParserEntityCheck(ctxt, 0, ent, 0);
	} else if (list != NULL) {
	    xmlFreeNodeList(list);
	    list = NULL;
	}
	if (ent->checked == 0)
	    ent->checked = 2;

        /* Prevent entity from being parsed and expanded twice (Bug 760367). */
        was_checked = 0;
    } else if (ent->checked != 1) {
	ctxt->nbentities += ent->checked / 2;
    }

    /*
     * Now that the entity content has been gathered
     * provide it to the application, this can take different forms based
     * on the parsing modes.
     */
    if (ent->children == NULL) {
	/*
	 * Probably running in SAX mode and the callbacks don't
	 * build the entity content. So unless we already went
	 * though parsing for first checking go though the entity
	 * content to generate callbacks associated to the entity
	 */
	if (was_checked != 0) {
	    void *user_data;
	    /*
	     * This is a bit hackish but this seems the best
	     * way to make sure both SAX and DOM entity support
	     * behaves okay.
	     */
	    if (ctxt->userData == ctxt)
		user_data = NULL;
	    else
		user_data = ctxt->userData;

	    if (ent->etype == XML_INTERNAL_GENERAL_ENTITY) {
		ctxt->depth++;
		ret = xmlParseBalancedChunkMemoryInternal(ctxt,
				   ent->content, user_data, NULL);
		ctxt->depth--;
	    } else if (ent->etype ==
		       XML_EXTERNAL_GENERAL_PARSED_ENTITY) {
		ctxt->depth++;
		ret = xmlParseExternalEntityPrivate(ctxt->myDoc, ctxt,
			   ctxt->sax, user_data, ctxt->depth,
			   ent->URI, ent->ExternalID, NULL);
		ctxt->depth--;
	    } else {
		ret = XML_ERR_ENTITY_PE_INTERNAL;
		xmlErrMsgStr(ctxt, XML_ERR_INTERNAL_ERROR,
			     "invalid entity type found\n", NULL);
	    }
	    if (ret == XML_ERR_ENTITY_LOOP) {
		xmlFatalErr(ctxt, XML_ERR_ENTITY_LOOP, NULL);
		return;
	    }
	}
	if ((ctxt->sax != NULL) && (ctxt->sax->reference != NULL) &&
	    (ctxt->replaceEntities == 0) && (!ctxt->disableSAX)) {
	    /*
	     * Entity reference callback comes second, it's somewhat
	     * superfluous but a compatibility to historical behaviour
	     */
	    ctxt->sax->reference(ctxt->userData, ent->name);
	}
	return;
    }

    /*
     * If we didn't get any children for the entity being built
     */
    if ((ctxt->sax != NULL) && (ctxt->sax->reference != NULL) &&
	(ctxt->replaceEntities == 0) && (!ctxt->disableSAX)) {
	/*
	 * Create a node.
	 */
	ctxt->sax->reference(ctxt->userData, ent->name);
	return;
    }

    if ((ctxt->replaceEntities) || (ent->children == NULL))  {
	/*
	 * There is a problem on the handling of _private for entities
	 * (bug 155816): Should we copy the content of the field from
	 * the entity (possibly overwriting some value set by the user
	 * when a copy is created), should we leave it alone, or should
	 * we try to take care of different situations?  The problem
	 * is exacerbated by the usage of this field by the xmlReader.
	 * To fix this bug, we look at _private on the created node
	 * and, if it's NULL, we copy in whatever was in the entity.
	 * If it's not NULL we leave it alone.  This is somewhat of a
	 * hack - maybe we should have further tests to determine
	 * what to do.
	 */
	if ((ctxt->node != NULL) && (ent->children != NULL)) {
	    /*
	     * Seems we are generating the DOM content, do
	     * a simple tree copy for all references except the first
	     * In the first occurrence list contains the replacement.
	     */
	    if (((list == NULL) && (ent->owner == 0)) ||
		(ctxt->parseMode == XML_PARSE_READER)) {
		xmlNodePtr nw = NULL, cur, firstChild = NULL;

		/*
		 * We are copying here, make sure there is no abuse
		 */
		ctxt->sizeentcopy += ent->length + 5;
		if (xmlParserEntityCheck(ctxt, 0, ent, ctxt->sizeentcopy))
		    return;

		/*
		 * when operating on a reader, the entities definitions
		 * are always owning the entities subtree.
		if (ctxt->parseMode == XML_PARSE_READER)
		    ent->owner = 1;
		 */

		cur = ent->children;
		while (cur != NULL) {
		    nw = xmlDocCopyNode(cur, ctxt->myDoc, 1);
		    if (nw != NULL) {
			if (nw->_private == NULL)
			    nw->_private = cur->_private;
			if (firstChild == NULL){
			    firstChild = nw;
			}
			nw = xmlAddChild(ctxt->node, nw);
		    }
		    if (cur == ent->last) {
			/*
			 * needed to detect some strange empty
			 * node cases in the reader tests
			 */
			if ((ctxt->parseMode == XML_PARSE_READER) &&
			    (nw != NULL) &&
			    (nw->type == XML_ELEMENT_NODE) &&
			    (nw->children == NULL))
			    nw->extra = 1;

			break;
		    }
		    cur = cur->next;
		}
#ifdef LIBXML_LEGACY_ENABLED
		if (ent->etype == XML_EXTERNAL_GENERAL_PARSED_ENTITY)
		  xmlAddEntityReference(ent, firstChild, nw);
#endif /* LIBXML_LEGACY_ENABLED */
	    } else if ((list == NULL) || (ctxt->inputNr > 0)) {
		xmlNodePtr nw = NULL, cur, next, last,
			   firstChild = NULL;

		/*
		 * We are copying here, make sure there is no abuse
		 */
		ctxt->sizeentcopy += ent->length + 5;
		if (xmlParserEntityCheck(ctxt, 0, ent, ctxt->sizeentcopy))
		    return;

		/*
		 * Copy the entity child list and make it the new
		 * entity child list. The goal is to make sure any
		 * ID or REF referenced will be the one from the
		 * document content and not the entity copy.
		 */
		cur = ent->children;
		ent->children = NULL;
		last = ent->last;
		ent->last = NULL;
		while (cur != NULL) {
		    next = cur->next;
		    cur->next = NULL;
		    cur->parent = NULL;
		    nw = xmlDocCopyNode(cur, ctxt->myDoc, 1);
		    if (nw != NULL) {
			if (nw->_private == NULL)
			    nw->_private = cur->_private;
			if (firstChild == NULL){
			    firstChild = cur;
			}
			xmlAddChild((xmlNodePtr) ent, nw);
		    }
		    xmlAddChild(ctxt->node, cur);
		    if (cur == last)
			break;
		    cur = next;
		}
		if (ent->owner == 0)
		    ent->owner = 1;
#ifdef LIBXML_LEGACY_ENABLED
		if (ent->etype == XML_EXTERNAL_GENERAL_PARSED_ENTITY)
		  xmlAddEntityReference(ent, firstChild, nw);
#endif /* LIBXML_LEGACY_ENABLED */
	    } else {
		const xmlChar *nbktext;

		/*
		 * the name change is to avoid coalescing of the
		 * node with a possible previous text one which
		 * would make ent->children a dangling pointer
		 */
		nbktext = xmlDictLookup(ctxt->dict, BAD_CAST "nbktext",
					-1);
		if (ent->children->type == XML_TEXT_NODE)
		    ent->children->name = nbktext;
		if ((ent->last != ent->children) &&
		    (ent->last->type == XML_TEXT_NODE))
		    ent->last->name = nbktext;
		xmlAddChildList(ctxt->node, ent->children);
	    }

	    /*
	     * This is to avoid a nasty side effect, see
	     * characters() in SAX.c
	     */
	    ctxt->nodemem = 0;
	    ctxt->nodelen = 0;
	    return;
	}
    }
}